

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

bool __thiscall leveldb::DBImpl::GetProperty(DBImpl *this,Slice *property,string *value)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int64_t iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  CompactionStats *pCVar6;
  long lVar7;
  int level_1;
  ulong uVar8;
  Slice in;
  uint64_t level;
  Slice prefix;
  char buf [100];
  
  value->_M_string_length = 0;
  *(value->_M_dataplus)._M_p = '\0';
  std::mutex::lock(&(this->mutex_).mu_);
  in.data_ = property->data_;
  in.size_ = property->size_;
  prefix.data_ = "leveldb.";
  prefix.size_ = 8;
  bVar1 = Slice::starts_with(&in,&prefix);
  if (bVar1) {
    Slice::remove_prefix(&in,prefix.size_);
    buf._0_8_ = anon_var_dwarf_16993;
    buf[8] = '\x12';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    bVar1 = Slice::starts_with(&in,(Slice *)buf);
    if (bVar1) {
      Slice::remove_prefix(&in,0x12);
      bVar1 = ConsumeDecimalNumber(&in,&level);
      if ((!bVar1) || (6 < level || in.size_ != 0)) goto LAB_0010c872;
      uVar2 = VersionSet::NumLevelFiles(this->versions_,(int)level);
      snprintf(buf,100,"%d",(ulong)uVar2);
      std::__cxx11::string::assign((char *)value);
    }
    else {
      buf._0_8_ = (long)"leveldb.stats" + 8;
      buf[8] = '\x05';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      bVar1 = operator==(&in,(Slice *)buf);
      if (bVar1) {
        memcpy(buf,
               "                               Compactions\nLevel  Files Size(MB) Time(sec) Read(MB) Write(MB)\n--------------------------------------------------\n"
               ,0x92);
        std::__cxx11::string::append((char *)value);
        pCVar6 = this->stats_;
        for (uVar8 = 0; uVar8 != 7; uVar8 = uVar8 + 1) {
          uVar2 = VersionSet::NumLevelFiles(this->versions_,(int)uVar8);
          if ((0 < (int)uVar2) || (0 < pCVar6->micros)) {
            iVar4 = VersionSet::NumLevelBytes(this->versions_,(int)uVar8);
            snprintf(buf,200,"%3d %8d %8.0f %9.0f %8.0f %9.0f\n",(double)iVar4 * 9.5367431640625e-07
                     ,(double)pCVar6->micros / 1000000.0,
                     (double)pCVar6->bytes_read * 9.5367431640625e-07,
                     (double)pCVar6->bytes_written * 9.5367431640625e-07,uVar8 & 0xffffffff,
                     (ulong)uVar2);
            std::__cxx11::string::append((char *)value);
          }
          pCVar6 = pCVar6 + 1;
        }
        bVar1 = true;
        goto LAB_0010c874;
      }
      buf._0_8_ = (long)"leveldb.sstables" + 8;
      buf[8] = '\b';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      bVar1 = operator==(&in,(Slice *)buf);
      if (bVar1) {
        Version::DebugString_abi_cxx11_((string *)buf,this->versions_->current_);
        std::__cxx11::string::operator=((string *)value,(string *)buf);
        std::__cxx11::string::_M_dispose();
      }
      else {
        buf._0_8_ = anon_var_dwarf_169ed;
        buf[8] = '\x18';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        bVar1 = operator==(&in,(Slice *)buf);
        if (!bVar1) goto LAB_0010c872;
        iVar3 = (*((this->options_).block_cache)->_vptr_Cache[9])();
        lVar7 = CONCAT44(extraout_var,iVar3);
        if (this->mem_ != (MemTable *)0x0) {
          sVar5 = MemTable::ApproximateMemoryUsage(this->mem_);
          lVar7 = lVar7 + sVar5;
        }
        if (this->imm_ != (MemTable *)0x0) {
          sVar5 = MemTable::ApproximateMemoryUsage(this->imm_);
          lVar7 = lVar7 + sVar5;
        }
        snprintf(buf,0x32,"%llu",lVar7);
        std::__cxx11::string::append((char *)value);
      }
    }
    bVar1 = true;
  }
  else {
LAB_0010c872:
    bVar1 = false;
  }
LAB_0010c874:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return bVar1;
}

Assistant:

bool DBImpl::GetProperty(const Slice& property, std::string* value) {
  value->clear();

  MutexLock l(&mutex_);
  Slice in = property;
  Slice prefix("leveldb.");
  if (!in.starts_with(prefix)) return false;
  in.remove_prefix(prefix.size());

  if (in.starts_with("num-files-at-level")) {
    in.remove_prefix(strlen("num-files-at-level"));
    uint64_t level;
    bool ok = ConsumeDecimalNumber(&in, &level) && in.empty();
    if (!ok || level >= config::kNumLevels) {
      return false;
    } else {
      char buf[100];
      std::snprintf(buf, sizeof(buf), "%d",
                    versions_->NumLevelFiles(static_cast<int>(level)));
      *value = buf;
      return true;
    }
  } else if (in == "stats") {
    char buf[200];
    std::snprintf(buf, sizeof(buf),
                  "                               Compactions\n"
                  "Level  Files Size(MB) Time(sec) Read(MB) Write(MB)\n"
                  "--------------------------------------------------\n");
    value->append(buf);
    for (int level = 0; level < config::kNumLevels; level++) {
      int files = versions_->NumLevelFiles(level);
      if (stats_[level].micros > 0 || files > 0) {
        std::snprintf(buf, sizeof(buf), "%3d %8d %8.0f %9.0f %8.0f %9.0f\n",
                      level, files, versions_->NumLevelBytes(level) / 1048576.0,
                      stats_[level].micros / 1e6,
                      stats_[level].bytes_read / 1048576.0,
                      stats_[level].bytes_written / 1048576.0);
        value->append(buf);
      }
    }
    return true;
  } else if (in == "sstables") {
    *value = versions_->current()->DebugString();
    return true;
  } else if (in == "approximate-memory-usage") {
    size_t total_usage = options_.block_cache->TotalCharge();
    if (mem_) {
      total_usage += mem_->ApproximateMemoryUsage();
    }
    if (imm_) {
      total_usage += imm_->ApproximateMemoryUsage();
    }
    char buf[50];
    std::snprintf(buf, sizeof(buf), "%llu",
                  static_cast<unsigned long long>(total_usage));
    value->append(buf);
    return true;
  }

  return false;
}